

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateDescriptor.cpp
# Opt level: O0

void extractDescriptor(Mat *in,vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *keyPointRotation
                      ,vector<Descriptor,_std::allocator<Descriptor>_> *keyPointDescriptor)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  bool bVar5;
  reference pKVar6;
  float *pfVar7;
  reference pvVar8;
  iterator __first;
  iterator __last;
  size_type sVar9;
  __type _Var10;
  __type _Var11;
  double dVar12;
  Descriptor local_390;
  Mat local_320 [8];
  Mat matBin;
  void *local_310;
  int local_2bc;
  int i_2;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_2a0;
  const_iterator local_298;
  int local_28c;
  int local_288;
  int binIdx;
  int pJ;
  int pI;
  int n;
  int m_1;
  undefined1 local_270 [8];
  vector<float,_std::allocator<float>_> gridBin;
  int j_1;
  int i_1;
  vector<float,_std::allocator<float>_> bin;
  float theta;
  float m;
  float diffJ;
  float diffI;
  int j;
  int i;
  Mat angle;
  Mat local_1c0 [8];
  Mat M;
  _OutputArray local_160;
  undefined1 local_148 [8];
  Mat window;
  undefined1 local_e4 [8];
  Rect patch;
  undefined1 local_c4 [8];
  KeyPoint point;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *__range1;
  Mat gKernel;
  int intervalBin;
  int nBin;
  int halfWSize;
  int wSize;
  vector<Descriptor,_std::allocator<Descriptor>_> *keyPointDescriptor_local;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *keyPointRotation_local;
  Mat *in_local;
  
  cv::Mat::Mat((Mat *)&__range1);
  __end1 = std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::begin(keyPointRotation);
  point._20_8_ = std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::end(keyPointRotation);
  while (bVar5 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>
                                     *)&point.octave), bVar5) {
    pKVar6 = __gnu_cxx::
             __normal_iterator<const_cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>
             ::operator*(&__end1);
    cv::KeyPoint::KeyPoint((KeyPoint *)local_c4,pKVar6);
    if ((((8.0 < (float)local_c4._0_4_) &&
         ((float)local_c4._0_4_ < (float)(*(int *)(in + 0xc) + -9))) &&
        (8.0 < (float)local_c4._4_4_)) && ((float)local_c4._4_4_ < (float)(*(int *)(in + 8) + -9)))
    {
      cv::Rect_<int>::Rect_
                ((Rect_<int> *)local_e4,(int)(((float)local_c4._0_4_ - 8.0) - 1.0),
                 (int)(((float)local_c4._4_4_ - 8.0) - 1.0),0x12,0x12);
      cv::Mat::Mat((Mat *)local_148,in,(Rect_ *)local_e4);
      cv::_OutputArray::_OutputArray(&local_160,(Mat *)local_148);
      cv::Mat::convertTo((_OutputArray *)local_148,(int)&local_160,1.0,0.0);
      cv::_OutputArray::~_OutputArray(&local_160);
      cv::Mat::Mat(local_1c0,0x10,0x10,5);
      cv::Mat::Mat((Mat *)&j,0x10,0x10,5);
      for (diffI = 1.4013e-45; (int)diffI < 0x11; diffI = (float)((int)diffI + 1)) {
        for (diffJ = 1.4013e-45; (int)diffJ < 0x11; diffJ = (float)((int)diffJ + 1)) {
          pfVar7 = cv::Mat::at<float>((Mat *)local_148,(int)diffI + 1,(int)diffJ);
          fVar1 = *pfVar7;
          pfVar7 = cv::Mat::at<float>((Mat *)local_148,(int)diffI + -1,(int)diffJ);
          fVar2 = *pfVar7;
          pfVar7 = cv::Mat::at<float>((Mat *)local_148,(int)diffI,(int)diffJ + 1);
          fVar3 = *pfVar7;
          pfVar7 = cv::Mat::at<float>((Mat *)local_148,(int)diffI,(int)diffJ + -1);
          fVar4 = *pfVar7;
          _Var10 = std::pow<float,double>(fVar1 - fVar2,2.0);
          _Var11 = std::pow<float,double>(fVar3 - fVar4,2.0);
          dVar12 = sqrt(_Var10 + _Var11);
          bin.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_ = (float)dVar12;
          pfVar7 = cv::Mat::at<float>(local_1c0,(int)diffI + -1,(int)diffJ + -1);
          *pfVar7 = (float)dVar12;
          dVar12 = std::atan2((double)(ulong)(uint)(fVar1 - fVar2),
                              (double)(ulong)(uint)(fVar3 - fVar4));
          bin.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._0_4_ = (SUB84(dVar12,0) * 180.0) / 3.1415927;
          if (bin.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._0_4_ < 0.0) {
            bin.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._0_4_ =
                 bin.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._0_4_ + 360.0;
          }
          bin.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._0_4_ =
               bin.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
               ._M_end_of_storage._0_4_ - point.pt.y;
          if (bin.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._0_4_ < 0.0) {
            bin.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._0_4_ =
                 bin.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._0_4_ + 360.0;
          }
          fVar1 = bin.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._0_4_;
          pfVar7 = cv::Mat::at<float>((Mat *)&j,(int)diffI + -1,(int)diffJ + -1);
          *pfVar7 = fVar1;
        }
      }
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)&j_1);
      for (gridBin.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
           ._M_end_of_storage._4_4_ = 0;
          gridBin.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_ < 0x10;
          gridBin.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_ =
               gridBin.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_ + 4) {
        for (gridBin.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
            (int)gridBin.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage < 0x10;
            gridBin.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ =
                 (int)gridBin.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 4) {
          m_1 = 0;
          std::allocator<float>::allocator((allocator<float> *)((long)&n + 3));
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)local_270,8,
                     (value_type_conflict *)&m_1,(allocator<float> *)((long)&n + 3));
          std::allocator<float>::~allocator((allocator<float> *)((long)&n + 3));
          for (pI = 0; pI < 4; pI = pI + 1) {
            for (pJ = 0; pJ < 4; pJ = pJ + 1) {
              binIdx = gridBin.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage._4_4_ + pI;
              local_288 = (int)gridBin.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + pJ;
              pfVar7 = cv::Mat::at<float>((Mat *)&j,binIdx,local_288);
              local_28c = (int)(*pfVar7 / 45.0);
              pfVar7 = cv::Mat::at<float>(local_1c0,binIdx,local_288);
              fVar1 = *pfVar7;
              pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                                 ((vector<float,_std::allocator<float>_> *)local_270,(long)local_28c
                                 );
              *pvVar8 = fVar1 + *pvVar8;
            }
          }
          local_2a0._M_current =
               (float *)std::vector<float,_std::allocator<float>_>::end
                                  ((vector<float,_std::allocator<float>_> *)&j_1);
          __gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>::
          __normal_iterator<float*>
                    ((__normal_iterator<float_const*,std::vector<float,std::allocator<float>>> *)
                     &local_298,&local_2a0);
          __first = std::vector<float,_std::allocator<float>_>::begin
                              ((vector<float,_std::allocator<float>_> *)local_270);
          __last = std::vector<float,_std::allocator<float>_>::end
                             ((vector<float,_std::allocator<float>_> *)local_270);
          std::vector<float,std::allocator<float>>::
          insert<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,void>
                    ((vector<float,std::allocator<float>> *)&j_1,local_298,
                     (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
                     __first._M_current,
                     (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
                     __last._M_current);
          std::vector<float,_std::allocator<float>_>::~vector
                    ((vector<float,_std::allocator<float>_> *)local_270);
        }
      }
      normVector((vector<float,_std::allocator<float>_> *)&j_1);
      for (local_2bc = 0;
          sVar9 = std::vector<float,_std::allocator<float>_>::size
                            ((vector<float,_std::allocator<float>_> *)&j_1),
          (ulong)(long)local_2bc < sVar9; local_2bc = local_2bc + 1) {
        pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)&j_1,(long)local_2bc);
        if (0.2 < *pvVar8) {
          pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                             ((vector<float,_std::allocator<float>_> *)&j_1,(long)local_2bc);
          *pvVar8 = 0.2;
        }
      }
      normVector((vector<float,_std::allocator<float>_> *)&j_1);
      cv::Mat::Mat(local_320,1,0x80,5);
      pfVar7 = std::vector<float,_std::allocator<float>_>::data
                         ((vector<float,_std::allocator<float>_> *)&j_1);
      sVar9 = std::vector<float,_std::allocator<float>_>::size
                        ((vector<float,_std::allocator<float>_> *)&j_1);
      memcpy(local_310,pfVar7,sVar9 << 2);
      Descriptor::Descriptor
                (&local_390,(int)(float)local_c4._0_4_,(int)(float)local_c4._4_4_,local_320,false);
      std::vector<Descriptor,_std::allocator<Descriptor>_>::push_back(keyPointDescriptor,&local_390)
      ;
      Descriptor::~Descriptor(&local_390);
      cv::Mat::~Mat(local_320);
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)&j_1);
      cv::Mat::~Mat((Mat *)&j);
      cv::Mat::~Mat(local_1c0);
      cv::Mat::~Mat((Mat *)local_148);
    }
    __gnu_cxx::
    __normal_iterator<const_cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>
    ::operator++(&__end1);
  }
  cv::Mat::~Mat((Mat *)&__range1);
  return;
}

Assistant:

void extractDescriptor(const Mat& in, const vector<KeyPoint>& keyPointRotation, vector<Descriptor>& keyPointDescriptor) {
	int wSize = 18;
	int halfWSize = (wSize - 2) / 2;
	int nBin = 36;
	int intervalBin = 360 / nBin;
	Mat gKernel;
	//getGaussianWeight(gKernel, wSize-2);
	
	for (KeyPoint point : keyPointRotation) {
		//discard key points to avoid corner conditions
		if (point.pt.x <= halfWSize || point.pt.x >= in.cols - halfWSize - 1 || point.pt.y <= halfWSize || point.pt.y >= in.rows - halfWSize - 1) continue;

		Rect patch = Rect(point.pt.x - halfWSize - 1, point.pt.y - halfWSize - 1, wSize, wSize);
		Mat window = Mat(in, patch);
		window.convertTo(window, CV_32F);
		Mat M = Mat(wSize-2, wSize-2, CV_32F);
		Mat angle = Mat(wSize-2, wSize-2, CV_32F);

		for (int i = 1; i < wSize-1; ++i) {
			for (int j = 1; j < wSize-1; ++j) {
				float diffI = window.at<float>(i + 1, j) - window.at<float>(i - 1, j);
				float diffJ = window.at<float>(i, j + 1) - window.at<float>(i, j - 1);
				float m = sqrt(pow(diffI, 2.0) + pow(diffJ, 2.0));
				M.at<float>(i - 1, j - 1) = m; //*gKernel.at<float>(i - 1, j - 1);
				float theta = atan2(diffI, diffJ) * 180 / M_PI;
				if (theta < 0) theta += 360;

				//normalize rotation
				theta -= point.angle;
				if (theta < 0) theta += 360;
				angle.at<float>(i - 1, j - 1) = theta;
			}
		}

		vector<float> bin;

		for (int i = 0; i < wSize-2; i+=4) {
			for (int j = 0; j < wSize-2; j+=4) {
				vector<float> gridBin(8,0);
				for (int m = 0; m < 4; ++m) {
					for (int n = 0; n < 4; ++n) {
						int pI = i + m;
						int pJ = j + n;
						int binIdx = static_cast<int>(angle.at<float>(pI , pJ) / 45);
						gridBin[binIdx] += M.at<float>(pI,pJ);
					}
				}
				bin.insert(bin.end(), gridBin.begin(), gridBin.end());
			}
		}

		//normalize+contrast invariance
		normVector(bin);
		for (int i = 0; i < bin.size(); ++i) {
			if (bin[i] > 0.2) bin[i] = 0.2;
		}
		normVector(bin);

		Mat matBin = Mat(1,128,CV_32F);
		//copy vector to mat in one row instead of one col
		memcpy(matBin.data, bin.data(), bin.size() * sizeof(float));

		keyPointDescriptor.push_back(Descriptor(point.pt.x, point.pt.y, matBin));
	}

}